

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O0

void __thiscall
vmips::Function::
call_void<std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
          (Function *this,weak_ptr<vmips::Function> *target,shared_ptr<vmips::VirtReg> *args,
          shared_ptr<vmips::VirtReg> *args_1,shared_ptr<vmips::VirtReg> *args_2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  initializer_list<std::shared_ptr<vmips::VirtReg>_> __l;
  element_type *peVar1;
  unsigned_long *puVar2;
  element_type *peVar3;
  shared_ptr<vmips::VirtReg> *local_118;
  shared_ptr<vmips::Instruction> local_e0 [2];
  allocator<std::shared_ptr<vmips::VirtReg>_> local_b9;
  shared_ptr<vmips::VirtReg> local_b8;
  shared_ptr<vmips::VirtReg> local_a8;
  shared_ptr<vmips::VirtReg> local_98;
  shared_ptr<vmips::VirtReg> local_88;
  vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
  local_78;
  weak_ptr<vmips::Function> local_60;
  undefined1 local_50 [8];
  shared_ptr<vmips::callfunc> calling;
  shared_ptr<vmips::VirtReg> *args_local_2;
  shared_ptr<vmips::VirtReg> *args_local_1;
  shared_ptr<vmips::VirtReg> *args_local;
  weak_ptr<vmips::Function> *target_local;
  Function *this_local;
  
  this[0x108] = (Function)0x1;
  this_00 = &calling.super___shared_ptr<vmips::callfunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::weak_ptr<vmips::Function>::lock((weak_ptr<vmips::Function> *)this_00);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  puVar2 = std::max<unsigned_long>
                     ((unsigned_long *)(this + 0x110),(unsigned_long *)(peVar1 + 0x128));
  *(unsigned_long *)(this + 0x110) = *puVar2;
  std::shared_ptr<vmips::Function>::~shared_ptr((shared_ptr<vmips::Function> *)this_00);
  local_60.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  std::shared_ptr<vmips::VirtReg>::shared_ptr(&local_b8,args);
  std::shared_ptr<vmips::VirtReg>::shared_ptr(&local_a8,args_1);
  std::shared_ptr<vmips::VirtReg>::shared_ptr(&local_98,args_2);
  local_88.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  local_88.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_b8;
  std::allocator<std::shared_ptr<vmips::VirtReg>_>::allocator(&local_b9);
  __l._M_len = (size_type)
               local_88.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  __l._M_array = (iterator)
                 local_88.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>::
  vector(&local_78,__l,&local_b9);
  std::
  make_shared<vmips::callfunc,decltype(nullptr),vmips::Function*,std::weak_ptr<vmips::Function>,std::vector<std::shared_ptr<vmips::VirtReg>,std::allocator<std::shared_ptr<vmips::VirtReg>>>>
            ((void **)local_50,
             (Function **)
             &local_60.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_60,
             (vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
              *)target);
  std::vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>::
  ~vector(&local_78);
  std::allocator<std::shared_ptr<vmips::VirtReg>_>::~allocator(&local_b9);
  local_118 = &local_88;
  do {
    local_118 = local_118 + -1;
    std::shared_ptr<vmips::VirtReg>::~shared_ptr(local_118);
  } while (local_118 != &local_b8);
  peVar3 = std::__shared_ptr_access<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(this + 0x148));
  std::shared_ptr<vmips::Instruction>::shared_ptr<vmips::callfunc,void>
            (local_e0,(shared_ptr<vmips::callfunc> *)local_50);
  std::
  vector<std::shared_ptr<vmips::Instruction>,_std::allocator<std::shared_ptr<vmips::Instruction>_>_>
  ::push_back((vector<std::shared_ptr<vmips::Instruction>,_std::allocator<std::shared_ptr<vmips::Instruction>_>_>
               *)(peVar3 + 0x30),local_e0);
  std::shared_ptr<vmips::Instruction>::~shared_ptr(local_e0);
  std::shared_ptr<vmips::callfunc>::~shared_ptr((shared_ptr<vmips::callfunc> *)local_50);
  return;
}

Assistant:

void call_void(std::weak_ptr<Function> target, Args &&... args) {
            has_sub = true;
            sub_argc = std::max(sub_argc, target.lock()->argc);
            auto calling = std::make_shared<callfunc>(nullptr, this, std::move(target),
                                                      std::vector<std::shared_ptr<VirtReg >>{
                                                              std::forward<Args>(args)...});
            cursor->instructions.push_back(calling);
        }